

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

UBool icu_63::LoadedNormalizer2Impl::isAcceptable
                (void *param_1,char *param_2,char *param_3,UDataInfo *pInfo)

{
  UDataInfo *pInfo_local;
  char *param_2_local;
  char *param_1_local;
  void *param_0_local;
  
  if (((((pInfo->size < 0x14) || (pInfo->isBigEndian != '\0')) || (pInfo->charsetFamily != '\0')) ||
      ((pInfo->dataFormat[0] != 'N' || (pInfo->dataFormat[1] != 'r')))) ||
     ((pInfo->dataFormat[2] != 'm' ||
      ((pInfo->dataFormat[3] != '2' || (pInfo->formatVersion[0] != '\x04')))))) {
    param_0_local._7_1_ = '\0';
  }
  else {
    param_0_local._7_1_ = '\x01';
  }
  return param_0_local._7_1_;
}

Assistant:

UBool U_CALLCONV
LoadedNormalizer2Impl::isAcceptable(void * /*context*/,
                                    const char * /* type */, const char * /*name*/,
                                    const UDataInfo *pInfo) {
    if(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->dataFormat[0]==0x4e &&    /* dataFormat="Nrm2" */
        pInfo->dataFormat[1]==0x72 &&
        pInfo->dataFormat[2]==0x6d &&
        pInfo->dataFormat[3]==0x32 &&
        pInfo->formatVersion[0]==4
    ) {
        // Normalizer2Impl *me=(Normalizer2Impl *)context;
        // uprv_memcpy(me->dataVersion, pInfo->dataVersion, 4);
        return TRUE;
    } else {
        return FALSE;
    }
}